

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

int AF_AActor_A_DropItem
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  AActor *source;
  PClassActor *type;
  VMValue *pVVar1;
  bool bVar2;
  bool local_4e;
  bool local_4b;
  int local_48;
  int local_44;
  int chance;
  int amount;
  MetaClass *spawntype;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1675,
                  "int AF_AActor_A_DropItem(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  bVar2 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar2 = true, (param->field_0).field_1.atag != 1)) {
    bVar2 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar2) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1675,
                  "int AF_AActor_A_DropItem(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  source = (AActor *)(param->field_0).field_1.a;
  local_4b = true;
  if (source != (AActor *)0x0) {
    local_4b = DObject::IsKindOf((DObject *)source,AActor::RegistrationInfo.MyClass);
  }
  if (local_4b == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1675,
                  "int AF_AActor_A_DropItem(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (numparam < 2) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1676,
                  "int AF_AActor_A_DropItem(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  bVar2 = false;
  if ((param[1].field_0.field_3.Type == '\x03') &&
     (bVar2 = true, param[1].field_0.field_1.atag != 1)) {
    bVar2 = param[1].field_0.field_1.a == (void *)0x0;
  }
  if (bVar2) {
    type = (PClassActor *)param[1].field_0.field_1.a;
    local_4e = true;
    if (type != (PClassActor *)0x0) {
      local_4e = PClass::IsDescendantOf((PClass *)type,AActor::RegistrationInfo.MyClass);
    }
    if (local_4e != false) {
      if (numparam < 3) {
        pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,2);
        if ((pVVar1->field_0).field_3.Type != '\0') {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x1677,
                        "int AF_AActor_A_DropItem(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,2);
        local_44 = (pVVar1->field_0).i;
      }
      else {
        if (param[2].field_0.field_3.Type != '\0') {
          __assert_fail("(param[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x1677,
                        "int AF_AActor_A_DropItem(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        local_44 = param[2].field_0.i;
      }
      if (numparam < 4) {
        pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
        if ((pVVar1->field_0).field_3.Type != '\0') {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x1678,
                        "int AF_AActor_A_DropItem(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
        local_48 = (pVVar1->field_0).i;
      }
      else {
        if (param[3].field_0.field_3.Type != '\0') {
          __assert_fail("(param[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x1678,
                        "int AF_AActor_A_DropItem(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        local_48 = param[3].field_0.i;
      }
      P_DropItem(source,type,local_44,local_48);
      return 0;
    }
    __assert_fail("spawntype == NULL || spawntype->IsDescendantOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1676,
                  "int AF_AActor_A_DropItem(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x1676,
                "int AF_AActor_A_DropItem(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_DropItem)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_CLASS   (spawntype, AActor);
	PARAM_INT_DEF(amount);
	PARAM_INT_DEF(chance);

	P_DropItem(self, spawntype, amount, chance);
	return 0;
}